

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-cpu.c
# Opt level: O0

void ggml_threadpool_pause(ggml_threadpool *threadpool)

{
  pthread_mutex_t *in_RDI;
  
  pthread_mutex_lock(in_RDI);
  if ((*(byte *)((long)in_RDI + 0x105) & 1) == 0) {
    ggml_threadpool_pause_locked((ggml_threadpool *)0x112ae4);
  }
  pthread_mutex_unlock(in_RDI);
  return;
}

Assistant:

void ggml_threadpool_pause(struct ggml_threadpool * threadpool) {
#ifndef GGML_USE_OPENMP
    ggml_mutex_lock(&threadpool->mutex);
    if (!threadpool->pause) {
       ggml_threadpool_pause_locked(threadpool);
    }
    ggml_mutex_unlock(&threadpool->mutex);
#else
    UNUSED(threadpool);
#endif
}